

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteUint(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this,uint u)

{
  Ch *buffer_00;
  char *pcVar1;
  char *end;
  char *buffer;
  uint u_local;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_local;
  
  buffer_00 = GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Push
                        (this->os_,10);
  pcVar1 = internal::u32toa(u,buffer_00);
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Pop
            (this->os_,10 - ((long)pcVar1 - (long)buffer_00));
  return true;
}

Assistant:

inline bool Writer<StringBuffer>::WriteUint(unsigned u) {
    char *buffer = os_->Push(10);
    const char* end = internal::u32toa(u, buffer);
    os_->Pop(static_cast<size_t>(10 - (end - buffer)));
    return true;
}